

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

void lddmc_serialize_totext(FILE *out)

{
  uint uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  avl_node_t *paVar4;
  avl_iter_t *iter;
  lddmc_ser *plVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t __size;
  
  paVar4 = lddmc_ser_reversed_set;
  if (lddmc_ser_reversed_set == (avl_node_t *)0x0) {
    __size = 0x10;
  }
  else {
    __size = (ulong)(lddmc_ser_reversed_set->height + 1) * 8 + 8;
  }
  iter = (avl_iter_t *)malloc(__size);
  iter->height = 0;
  iter[1].height = (size_t)paVar4;
  fputc(0x5b,(FILE *)out);
  while( true ) {
    plVar5 = lddmc_ser_reversed_iter_next(iter);
    if (plVar5 == (lddmc_ser *)0x0) break;
    puVar2 = nodes->data;
    sVar3 = plVar5->assigned;
    lVar8 = plVar5->mdd * 0x10;
    uVar1 = *(uint *)(puVar2 + lVar8 + 6);
    sVar6 = lddmc_serialize_get(*(ulong *)(puVar2 + lVar8 + 8) >> 0x11);
    sVar7 = lddmc_serialize_get(*(ulong *)(puVar2 + lVar8) >> 1 & 0x7fffffffffff);
    fprintf((FILE *)out,"(%zu,v=%u,d=%zu,r=%zu),",sVar3,(ulong)uVar1,sVar6,sVar7);
  }
  fputc(0x5d,(FILE *)out);
  free(iter);
  return;
}

Assistant:

void
lddmc_serialize_totext(FILE *out)
{
    avl_iter_t *it = lddmc_ser_reversed_iter(lddmc_ser_reversed_set);
    struct lddmc_ser *s;

    fprintf(out, "[");
    while ((s=lddmc_ser_reversed_iter_next(it))) {
        MDD mdd = s->mdd;
        mddnode_t n = LDD_GETNODE(mdd);
        fprintf(out, "(%zu,v=%u,d=%zu,r=%zu),", s->assigned,
                                                mddnode_getvalue(n),
                                                lddmc_serialize_get(mddnode_getdown(n)),
                                                lddmc_serialize_get(mddnode_getright(n)));
    }
    fprintf(out, "]");

    lddmc_ser_reversed_iter_free(it);
}